

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test6::initIteration(GPUShaderFP64Test6 *this,_test_case *test_case)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined8 local_110;
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  char *gs_body_raw_ptr;
  char *fs_body_raw_ptr;
  char *cs_body_raw_ptr;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  long local_20;
  Functions *gl;
  _test_case *test_case_local;
  GPUShaderFP64Test6 *this_local;
  
  gl = (Functions *)test_case;
  test_case_local = (_test_case *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar1);
  getComputeShaderBody_abi_cxx11_(&local_40,this,(_test_case *)gl);
  std::__cxx11::string::operator=((string *)&gl->attachShader,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  getFragmentShaderBody_abi_cxx11_(&local_60,this,(_test_case *)gl);
  std::__cxx11::string::operator=((string *)&gl->beginTransformFeedback,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  getGeometryShaderBody_abi_cxx11_(&local_80,this,(_test_case *)gl);
  std::__cxx11::string::operator=((string *)&gl->bindBufferRange,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  getTessellationControlShaderBody_abi_cxx11_(&local_a0,this,(_test_case *)gl);
  std::__cxx11::string::operator=((string *)&gl->bindFragDataLocationIndexed,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  getTessellationEvaluationShaderBody_abi_cxx11_(&local_c0,this,(_test_case *)gl);
  std::__cxx11::string::operator=((string *)&gl->bindMultiTextureEXT,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  getVertexShaderBody_abi_cxx11_((string *)&cs_body_raw_ptr,this,(_test_case *)gl);
  std::__cxx11::string::operator=((string *)&gl->bindSamplers,(string *)&cs_body_raw_ptr);
  std::__cxx11::string::~string((string *)&cs_body_raw_ptr);
  fs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  gs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  tc_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  te_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  vs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  local_110 = std::__cxx11::string::c_str();
  if (this->m_cs_id != 0) {
    (**(code **)(local_20 + 0x12b8))(this->m_cs_id,1,&fs_body_raw_ptr,0);
  }
  (**(code **)(local_20 + 0x12b8))(this->m_fs_id,1,&gs_body_raw_ptr,0);
  (**(code **)(local_20 + 0x12b8))(this->m_gs_id,1,&tc_body_raw_ptr,0);
  (**(code **)(local_20 + 0x12b8))(this->m_tc_id,1,&te_body_raw_ptr,0);
  (**(code **)(local_20 + 0x12b8))(this->m_te_id,1,&vs_body_raw_ptr,0);
  (**(code **)(local_20 + 0x12b8))(this->m_vs_id,1,&local_110,0);
  err = (**(code **)(local_20 + 0x800))();
  glu::checkError(err,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2237);
  return;
}

Assistant:

void GPUShaderFP64Test6::initIteration(_test_case& test_case)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	test_case.cs_shader_body = getComputeShaderBody(test_case);
	test_case.fs_shader_body = getFragmentShaderBody(test_case);
	test_case.gs_shader_body = getGeometryShaderBody(test_case);
	test_case.tc_shader_body = getTessellationControlShaderBody(test_case);
	test_case.te_shader_body = getTessellationEvaluationShaderBody(test_case);
	test_case.vs_shader_body = getVertexShaderBody(test_case);

	/* Assign the bodies to relevant shaders */
	const char* cs_body_raw_ptr = test_case.cs_shader_body.c_str();
	const char* fs_body_raw_ptr = test_case.fs_shader_body.c_str();
	const char* gs_body_raw_ptr = test_case.gs_shader_body.c_str();
	const char* tc_body_raw_ptr = test_case.tc_shader_body.c_str();
	const char* te_body_raw_ptr = test_case.te_shader_body.c_str();
	const char* vs_body_raw_ptr = test_case.vs_shader_body.c_str();

	/* m_cs_id is initialized only if compute_shader is supported */
	if (0 != m_cs_id)
	{
		gl.shaderSource(m_cs_id, 1 /* count */, &cs_body_raw_ptr, DE_NULL /* length */);
	}

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_gs_id, 1 /* count */, &gs_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_tc_id, 1 /* count */, &tc_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_te_id, 1 /* count */, &te_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");
}